

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLifetimeTests.cpp
# Opt level: O1

void deqp::gls::LifetimeTests::details::readRectangle
               (RenderContext *renderCtx,Rectangle *rect,Surface *dst)

{
  int x;
  int y;
  void *data;
  TextureFormat local_50;
  PixelBufferAccess local_48;
  
  tcu::Surface::setSize(dst,rect->width,rect->height);
  x = rect->x;
  y = rect->y;
  local_50.order = RGBA;
  local_50.type = UNORM_INT8;
  data = (void *)(dst->m_pixels).m_cap;
  if (data != (void *)0x0) {
    data = (dst->m_pixels).m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess(&local_48,&local_50,dst->m_width,dst->m_height,1,data);
  glu::readPixels(renderCtx,x,y,&local_48);
  return;
}

Assistant:

void readRectangle (const RenderContext& renderCtx, const Rectangle& rect, Surface& dst)
{
	dst.setSize(rect.width, rect.height);
	glu::readPixels(renderCtx, rect.x, rect.y, dst.getAccess());
}